

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap::iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::KeyValuePair>,_unsigned_long>
* __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap
::FindHelper(pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap::iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::KeyValuePair>,_unsigned_long>
             *__return_storage_ptr__,InnerMap *this,
            basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,TreeIterator *it)

{
  void **ppvVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  *this_00;
  __type _Var2;
  size_type index;
  iterator tree_it;
  Node *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  index = BucketNumber(this,k);
  ppvVar1 = this->table_;
  __lhs = (Node *)ppvVar1[index];
  if (__lhs != (Node *)0x0) {
    if (__lhs == (Node *)ppvVar1[index ^ 1]) {
      index = index & 0xfffffffffffffffe;
      this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                 *)ppvVar1[index];
      local_38 = k;
      tree_it = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                ::find(this_00,&local_38);
      if ((_Rb_tree_header *)tree_it._M_node != &(this_00->_M_impl).super__Rb_tree_header) {
        if (it != (TreeIterator *)0x0) {
          it->_M_node = tree_it._M_node;
        }
        iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::KeyValuePair>
        ::iterator_base(&__return_storage_ptr__->first,(TreeIterator)tree_it._M_node,this,index);
        goto LAB_004c6684;
      }
    }
    else {
      do {
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,k);
        if (_Var2) {
          (__return_storage_ptr__->first).node_ = __lhs;
          (__return_storage_ptr__->first).m_ = this;
          (__return_storage_ptr__->first).bucket_index_ = index;
          goto LAB_004c6684;
        }
        __lhs = __lhs->next;
      } while (__lhs != (Node *)0x0);
    }
  }
  (__return_storage_ptr__->first).node_ = (Node *)0x0;
  (__return_storage_ptr__->first).m_ = (InnerMap *)0x0;
  (__return_storage_ptr__->first).bucket_index_ = 0;
LAB_004c6684:
  __return_storage_ptr__->second = index;
  return __return_storage_ptr__;
}

Assistant:

std::pair<const_iterator, size_type> FindHelper(const Key& k,
                                                    TreeIterator* it) const {
      size_type b = BucketNumber(k);
      if (TableEntryIsNonEmptyList(b)) {
        Node* node = static_cast<Node*>(table_[b]);
        do {
          if (IsMatch(*KeyPtrFromNodePtr(node), k)) {
            return std::make_pair(const_iterator(node, this, b), b);
          } else {
            node = node->next;
          }
        } while (node != NULL);
      } else if (TableEntryIsTree(b)) {
        GOOGLE_DCHECK_EQ(table_[b], table_[b ^ 1]);
        b &= ~static_cast<size_t>(1);
        Tree* tree = static_cast<Tree*>(table_[b]);
        Key* key = const_cast<Key*>(&k);
        typename Tree::iterator tree_it = tree->find(key);
        if (tree_it != tree->end()) {
          if (it != NULL) *it = tree_it;
          return std::make_pair(const_iterator(tree_it, this, b), b);
        }
      }
      return std::make_pair(end(), b);
    }